

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

UBool __thiscall
icu_63::UCharsTrieBuilder::UCTLinearMatchNode::operator==(UCTLinearMatchNode *this,Node *other)

{
  UBool UVar1;
  int32_t iVar2;
  bool bVar3;
  
  if (this != (UCTLinearMatchNode *)other) {
    UVar1 = StringTrieBuilder::LinearMatchNode::operator==(&this->super_LinearMatchNode,other);
    if (UVar1 == '\0') {
      bVar3 = false;
    }
    else {
      iVar2 = u_memcmp_63(this->s,*(UChar **)&other[2].hash,(this->super_LinearMatchNode).length);
      bVar3 = iVar2 == 0;
    }
    return bVar3;
  }
  return '\x01';
}

Assistant:

UBool
UCharsTrieBuilder::UCTLinearMatchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!LinearMatchNode::operator==(other)) {
        return FALSE;
    }
    const UCTLinearMatchNode &o=(const UCTLinearMatchNode &)other;
    return 0==u_memcmp(s, o.s, length);
}